

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_deserializer.hpp
# Opt level: O1

short __thiscall duckdb::BinaryDeserializer::VarIntDecode<short>(BinaryDeserializer *this)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  idx_t shift;
  ulong uVar4;
  ushort uVar5;
  byte *pbVar6;
  uint8_t byte;
  ushort uVar7;
  long lVar8;
  bool bVar9;
  uint8_t buffer [16];
  byte local_28 [16];
  
  pbVar6 = local_28;
  local_28[0] = 0;
  local_28[1] = 0;
  local_28[2] = 0;
  local_28[3] = 0;
  local_28[4] = 0;
  local_28[5] = 0;
  local_28[6] = 0;
  local_28[7] = 0;
  local_28[8] = 0;
  local_28[9] = 0;
  local_28[10] = 0;
  local_28[0xb] = 0;
  local_28[0xc] = 0;
  local_28[0xd] = 0;
  local_28[0xe] = 0;
  local_28[0xf] = 0;
  lVar8 = 0;
  do {
    (**this->stream->_vptr_ReadStream)(this->stream,local_28 + lVar8,1);
    if (-1 < (char)local_28[lVar8]) break;
    bVar9 = lVar8 != 0xf;
    lVar8 = lVar8 + 1;
  } while (bVar9);
  uVar3 = 0;
  uVar4 = 0;
  do {
    bVar1 = *pbVar6;
    bVar2 = (byte)uVar4 & 0x1f;
    uVar3 = uVar3 | (bVar1 & 0x7f) << bVar2;
    uVar4 = uVar4 + 7;
    pbVar6 = pbVar6 + 1;
  } while ((char)bVar1 < '\0');
  uVar7 = (ushort)(0 << bVar2);
  uVar5 = (ushort)(-1 << ((byte)uVar4 & 0x1f));
  if (bVar1 < 0x40) {
    uVar5 = uVar7;
  }
  if (0xf < uVar4) {
    uVar5 = uVar7;
  }
  return (ushort)uVar3 | uVar5;
}

Assistant:

T VarIntDecode() {
		// FIXME: maybe we should pass a source to EncodingUtil instead
		uint8_t buffer[16] = {};
		idx_t varint_size;
		for (varint_size = 0; varint_size < 16; varint_size++) {
			ReadData(buffer + varint_size, 1);
			if (!(buffer[varint_size] & 0x80)) {
				varint_size++;
				break;
			}
		}
		T value;
		auto read_size = EncodingUtil::DecodeLEB128<T>(buffer, value);
		D_ASSERT(read_size == varint_size);
		(void)read_size;
		return value;
	}